

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  rtree_leaf_elm_t *prVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  tsdn_t *tsdn_00;
  arena_t *arena_00;
  ticker_t *ptVar5;
  ulong in_RSI;
  arena_t *in_RDI;
  arena_t *arena;
  extent_t *extent;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  uint8_t state;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  ticker_t *decay_ticker;
  tsd_t *tsd;
  uintptr_t bits;
  void *result;
  tsdn_t *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  extent_t *extent_00;
  undefined1 in_stack_fffffffffffffbf6;
  undefined1 in_stack_fffffffffffffbf7;
  rtree_leaf_elm_t *in_stack_fffffffffffffbf8;
  rtree_ctx_t *in_stack_fffffffffffffc00;
  rtree_t *in_stack_fffffffffffffc08;
  tsdn_t *in_stack_fffffffffffffc10;
  rtree_ctx_t *local_280;
  uint local_1bc;
  tsd_t *local_160;
  atomic_p_t local_28;
  uint local_c;
  
  local_280 = (rtree_ctx_t *)&stack0xfffffffffffffbe0;
  if (in_RDI == (arena_t *)0x0) {
    rtree_ctx_data_init(local_280);
  }
  else {
    local_280 = (rtree_ctx_t *)&(in_RDI->stats).decay_dirty;
  }
  uVar3 = in_RSI >> 0x1e & 0xf;
  uVar4 = in_RSI & 0xffffffffc0000000;
  if (local_280->cache[uVar3].leafkey == uVar4) {
    local_160 = (tsd_t *)(local_280->cache[uVar3].leaf + (in_RSI >> 0xc & 0x3ffff));
  }
  else if (local_280->l2_cache[0].leafkey == uVar4) {
    prVar1 = local_280->l2_cache[0].leaf;
    local_280->l2_cache[0].leafkey = local_280->cache[uVar3].leafkey;
    local_280->l2_cache[0].leaf = local_280->cache[uVar3].leaf;
    local_280->cache[uVar3].leafkey = uVar4;
    local_280->cache[uVar3].leaf = prVar1;
    local_160 = (tsd_t *)(prVar1 + (in_RSI >> 0xc & 0x3ffff));
  }
  else {
    for (local_1bc = 1; local_1bc < 8; local_1bc = local_1bc + 1) {
      if (local_280->l2_cache[local_1bc].leafkey == uVar4) {
        prVar1 = local_280->l2_cache[local_1bc].leaf;
        if (local_1bc == 0) {
          local_280->l2_cache[0].leafkey = local_280->cache[uVar3].leafkey;
          local_280->l2_cache[0].leaf = local_280->cache[uVar3].leaf;
        }
        else {
          local_280->l2_cache[local_1bc].leafkey = local_280->l2_cache[local_1bc - 1].leafkey;
          local_280->l2_cache[local_1bc].leaf = local_280->l2_cache[local_1bc - 1].leaf;
          local_280->l2_cache[local_1bc - 1].leafkey = local_280->cache[uVar3].leafkey;
          local_280->l2_cache[local_1bc - 1].leaf = local_280->cache[uVar3].leaf;
        }
        local_280->cache[uVar3].leafkey = uVar4;
        local_280->cache[uVar3].leaf = prVar1;
        local_160 = (tsd_t *)(prVar1 + (in_RSI >> 0xc & 0x3ffff));
        goto LAB_0011719f;
      }
    }
    local_160 = (tsd_t *)rtree_leaf_elm_lookup_hard
                                   (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                    in_stack_fffffffffffffc00,(uintptr_t)in_stack_fffffffffffffbf8,
                                    (_Bool)in_stack_fffffffffffffbf7,
                                    (_Bool)in_stack_fffffffffffffbf6);
  }
LAB_0011719f:
  switch(0x1172fa) {
  case 0:
    local_c = 0;
    break;
  case 1:
    local_c = 2;
  }
  if (local_c - 1 < 2) {
    local_28.repr = *(void **)local_160;
  }
  else if (local_c == 5) {
    local_28.repr = *(void **)local_160;
  }
  else {
    local_28.repr = *(void **)local_160;
  }
  tsdn_00 = (tsdn_t *)(((long)local_28.repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  extent_00 = (extent_t *)0x0;
  arena_00 = extent_arena_get((extent_t *)0x0);
  arena_dalloc_bin(tsdn_00,arena_00,extent_00,local_160);
  malloc_mutex_assert_not_owner(in_stack_fffffffffffffb88,(malloc_mutex_t *)0x117429);
  malloc_mutex_assert_not_owner(in_stack_fffffffffffffb88,(malloc_mutex_t *)0x11743f);
  if (in_RDI != (arena_t *)0x0) {
    arena_ind_get((arena_t *)0x1174c4);
    ptVar5 = decay_ticker_get(local_160,local_c);
    if ((ptVar5 != (ticker_t *)0x0) && (_Var2 = ticker_ticks((ticker_t *)in_RDI,0), _Var2)) {
      arena_decay((tsdn_t *)CONCAT44(local_c,in_stack_fffffffffffffb90),in_RDI,false,false);
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	extent_t *extent = iealloc(tsdn, ptr);
	arena_t *arena = extent_arena_get(extent);

	arena_dalloc_bin(tsdn, arena, extent, ptr);
	arena_decay_tick(tsdn, arena);
}